

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O1

void __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
::KeyValueShrinkableStorage
          (KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
           *this,KeyValueShrinkableStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                 *oldStorage,KeyIndexStorage *actualIndex,string *notSortedStorageFilename,
          string *sortedStorageFilename,size_t indexBatchSize)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void,_supermap::Key<3UL>_>
  *this_01;
  InputIterator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_11UL,_void>
  indexIterator;
  path local_138;
  string local_108;
  undefined1 local_e0 [24];
  _Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_*,_false>
  local_c8;
  shared_ptr<supermap::io::FileManager> local_c0;
  InnerRegisterSupplier *local_b0;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  *local_a8;
  long *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:88:60)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:88:60)>
             ::_M_manager;
  OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ::OrderedStorage((OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
                    *)this,(InnerRegisterSupplier *)&local_58);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_002070f8;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_00206ff0;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_138,sortedStorageFilename,auto_format);
  this_01 = &this->sortedStorage_;
  peVar1 = (oldStorage->sortedStorage_).
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (peVar1->manager_).
          super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:91:24)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:91:24)>
             ::_M_manager;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ::SingleFileIndexedStorage
            (&this_01->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
             ,&local_138,&local_c0,(InnerRegisterSupplier *)&local_78);
  (this->sortedStorage_).
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  .
  super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  .
  super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = (_func_int **)&PTR_append_002071f0;
  (this->sortedStorage_).
  super_Findable<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_supermap::Key<3UL>_>
  ._vptr_Findable = (_func_int **)&DAT_00207238;
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_138);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_138,notSortedStorageFilename,auto_format);
  peVar1 = (oldStorage->sortedStorage_).
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_e0._16_8_ =
       (peVar1->manager_).super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_c8._M_head_impl =
       (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
        *)(peVar1->manager_).
          super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_head_impl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_head_impl)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_head_impl)->_M_use_count + 1
      ;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_head_impl)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_head_impl)->_M_use_count + 1
      ;
    }
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:94:27)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_void>_>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/KeyValueShrinkableStorage.hpp:94:27)>
             ::_M_manager;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
  ::SingleFileIndexedStorage
            (&this->notSortedStorage_,&local_138,
             (shared_ptr<supermap::io::FileManager> *)(local_e0 + 0x10),
             (InnerRegisterSupplier *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_c8._M_head_impl !=
      (StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_head_impl);
  }
  std::filesystem::__cxx11::path::~path(&local_138);
  local_a8 = &this->notSortedStorage_;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>_>_>_()>
  ::function(&this->innerRegisterSupplier_,&oldStorage->innerRegisterSupplier_);
  local_b0 = &this->innerRegisterSupplier_;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
  ::getDataIterator((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<3UL>_>_>_>
                     *)local_e0);
  peVar1 = (this->sortedStorage_).
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (peVar1->manager_).
           super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_
            (&local_108,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,void>
              *)this_01);
  std::filesystem::__cxx11::path::path(&local_138,&local_108,auto_format);
  (*peVar2->_vptr_FileManager[1])(&local_a0,peVar2,&local_138,0);
  std::filesystem::__cxx11::path::~path(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  io::InputIterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,11ul,void>::
  collectWith<supermap::io::InputIterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,11ul,void>::collect(unsigned_long)::_lambda(auto:1&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>
            (&local_138,local_e0,indexBatchSize);
  (*(this->sortedStorage_).
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
    .
    super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
    ._vptr_Cloneable[5])
            (&(this->sortedStorage_).
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              .
              super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
              .register_,
             (this->sortedStorage_).
             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
             .
             super_IndexedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
             .
             super_OrderedStorage<supermap::KeyValue<supermap::Key<3UL>,_supermap::ByteArray<4UL>_>,_unsigned_long,_void>
             .register_.count_);
  if (local_138._M_pathname._M_dataplus._M_p != (pointer)local_138._M_pathname._M_string_length) {
    do {
      SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,void>
      ::
      appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>>>,supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>::KeyValueShrinkableStorage(supermap::KeyValueShrinkableStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>>const&,supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<3ul>>>,supermap::Key<3ul>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_long)::_lambda(supermap::KeyValue<supermap::Key<3ul>,unsigned_long>const&)_1_,supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,void>
                ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<3ul>,supermap::ByteArray<4ul>>,unsigned_long,void>
                  *)this_01,
                 (__normal_iterator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_*,_std::vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>_>
                  )local_138._M_pathname._M_dataplus._M_p,
                 (__normal_iterator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_*,_std::vector<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<3UL>,_unsigned_long>_>_>_>
                  )local_138._M_pathname._M_string_length,(anon_class_8_1_9d0d8c12)oldStorage);
      io::
      InputIterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,11ul,void>::
      collectWith<supermap::io::InputIterator<supermap::KeyValue<supermap::Key<3ul>,unsigned_long>,unsigned_long,11ul,void>::collect(unsigned_long)::_lambda(auto:1&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<3ul>,unsigned_long>>
                (&local_108,local_e0,indexBatchSize);
      uVar4 = local_138._M_pathname.field_2._M_allocated_capacity;
      _Var3._M_p = local_138._M_pathname._M_dataplus._M_p;
      local_138._M_pathname._M_dataplus._M_p = local_108._M_dataplus._M_p;
      local_138._M_pathname._M_string_length = local_108._M_string_length;
      local_138._M_pathname.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      if ((KeyValue<supermap::Key<3UL>,_unsigned_long> *)_Var3._M_p !=
          (KeyValue<supermap::Key<3UL>,_unsigned_long> *)0x0) {
        operator_delete(_Var3._M_p,uVar4 - (long)_Var3._M_p);
      }
      if ((KeyValue<supermap::Key<3UL>,_unsigned_long> *)local_108._M_dataplus._M_p !=
          (KeyValue<supermap::Key<3UL>,_unsigned_long> *)0x0) {
        operator_delete(local_108._M_dataplus._M_p,
                        local_108.field_2._M_allocated_capacity - (long)local_108._M_dataplus._M_p);
      }
    } while (local_138._M_pathname._M_dataplus._M_p !=
             (pointer)local_138._M_pathname._M_string_length);
  }
  (**(code **)(*local_a0 + 8))(local_a0);
  if ((KeyValue<supermap::Key<3UL>,_unsigned_long> *)local_138._M_pathname._M_dataplus._M_p !=
      (KeyValue<supermap::Key<3UL>,_unsigned_long> *)0x0) {
    operator_delete(local_138._M_pathname._M_dataplus._M_p,
                    local_138._M_pathname.field_2._M_allocated_capacity -
                    (long)local_138._M_pathname._M_dataplus._M_p);
  }
  (**(code **)(*local_a0 + 0x18))(local_a0);
  if ((_func_int **)local_e0._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_e0._0_8_ + 0x18))();
  }
  return;
}

Assistant:

explicit KeyValueShrinkableStorage(
        const KeyValueShrinkableStorage &oldStorage,
        const KeyIndexStorage &actualIndex,
        const std::string &notSortedStorageFilename,
        const std::string &sortedStorageFilename,
        std::size_t indexBatchSize
    ) : IndexedStorage<KeyValue<Key, Value>, IndexT, void>([]() { return std::make_unique<VoidRegister<KV>>(); }),
        sortedStorage_(sortedStorageFilename,
                       oldStorage.getFileManager(),
                       []() { return std::make_unique<VoidRegister<KV>>(); }),
        notSortedStorage_(notSortedStorageFilename,
                          oldStorage.getFileManager(),
                          []() { return std::make_unique<VoidRegister<KV>>(); }),
        innerRegisterSupplier_(oldStorage.innerRegisterSupplier_) {
        auto indexIterator = actualIndex.getDataIterator();
        io::OutputIterator<KV> keyValueOutputIterator
            = getFileManager()->template getOutputIterator<KV>(
                sortedStorage_.getStorageFilePath(),
                false
            );
        std::vector<KeyIndex> currentBatchIndex = indexIterator.collect(indexBatchSize);
        sortedStorage_.getRegister().reserve(sortedStorage_.getItemsCount());
        while (!currentBatchIndex.empty()) {
            sortedStorage_.appendAll(
                currentBatchIndex.begin(),
                currentBatchIndex.end(),
                [&](const KeyIndex &keyIndex) {
                    return KeyValue{
                        keyIndex.key,
                        oldStorage.get(keyIndex.value).value
                    };
                }
            );
            currentBatchIndex = indexIterator.collect(indexBatchSize);
        }
        keyValueOutputIterator.flush();
    }